

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

void SetupMatrices(VP8Encoder *enc)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  VP8Matrix *m_00;
  long *in_RDI;
  int q_uv;
  int q_i16;
  int q_i4;
  int q;
  VP8SegmentInfo *m;
  int num_segments;
  int tlambda_scale;
  int i;
  int local_34;
  int local_c;
  
  if ((int)in_RDI[0xb88] < 4) {
    local_34 = 0;
  }
  else {
    local_34 = *(int *)(*in_RDI + 0x1c);
  }
  lVar1 = in_RDI[4];
  for (local_c = 0; local_c < (int)lVar1; local_c = local_c + 1) {
    m_00 = (VP8Matrix *)(in_RDI + (long)local_c * 0x5d + 0x4c);
    iVar3 = *(int *)(m_00[3].q_ + 4);
    iVar2 = clip(iVar3 + *(int *)((long)in_RDI + 0xe0c),0,0x7f);
    m_00->q_[0] = (ushort)kDcTable[iVar2];
    iVar2 = clip(iVar3,0,0x7f);
    m_00->q_[1] = kAcTable[iVar2];
    iVar2 = clip(iVar3 + (int)in_RDI[0x1c2],0,0x7f);
    m_00[1].q_[0] = (ushort)kDcTable[iVar2] << 1;
    iVar2 = clip(iVar3 + *(int *)((long)in_RDI + 0xe14),0,0x7f);
    m_00[1].q_[1] = kAcTable2[iVar2];
    iVar2 = clip(iVar3 + (int)in_RDI[0x1c3],0,0x75);
    m_00[2].q_[0] = (ushort)kDcTable[iVar2];
    iVar3 = clip(iVar3 + *(int *)((long)in_RDI + 0xe1c),0,0x7f);
    m_00[2].q_[1] = kAcTable[iVar3];
    iVar3 = ExpandMatrix(m_00,0);
    iVar2 = ExpandMatrix(m_00 + 1,1);
    iVar4 = ExpandMatrix(m_00 + 2,2);
    *(int *)(m_00[3].q_ + 0xe) = iVar3 * 3 * iVar3 >> 7;
    *(int *)(m_00[3].q_ + 0xc) = iVar2 * 3 * iVar2;
    *(int *)m_00[3].iq_ = iVar4 * 3 * iVar4 >> 6;
    *(int *)(m_00[3].iq_ + 2) = iVar3 * iVar3 >> 7;
    *(int *)(m_00[3].iq_ + 10) = iVar3 * 7 * iVar3 >> 3;
    *(int *)(m_00[3].iq_ + 8) = iVar2 * iVar2 >> 2;
    *(int *)(m_00[3].iq_ + 0xc) = iVar4 * iVar4 * 2;
    *(int *)(m_00[3].iq_ + 6) = local_34 * iVar3 >> 5;
    CheckLambdaValue((int *)(m_00[3].q_ + 0xe));
    CheckLambdaValue((int *)(m_00[3].q_ + 0xc));
    CheckLambdaValue((int *)m_00[3].iq_);
    CheckLambdaValue((int *)(m_00[3].iq_ + 2));
    CheckLambdaValue((int *)(m_00[3].iq_ + 10));
    CheckLambdaValue((int *)(m_00[3].iq_ + 8));
    CheckLambdaValue((int *)(m_00[3].iq_ + 0xc));
    CheckLambdaValue((int *)(m_00[3].iq_ + 6));
    *(uint *)(m_00[3].q_ + 10) = (uint)m_00->q_[0] * 0x14;
    m_00[3].q_[8] = 0;
    m_00[3].q_[9] = 0;
    *(long *)m_00[3].bias_ = (long)(iVar3 * 1000 * iVar3);
  }
  return;
}

Assistant:

static void SetupMatrices(VP8Encoder* enc) {
  int i;
  const int tlambda_scale =
    (enc->method_ >= 4) ? enc->config_->sns_strength
                        : 0;
  const int num_segments = enc->segment_hdr_.num_segments_;
  for (i = 0; i < num_segments; ++i) {
    VP8SegmentInfo* const m = &enc->dqm_[i];
    const int q = m->quant_;
    int q_i4, q_i16, q_uv;
    m->y1_.q_[0] = kDcTable[clip(q + enc->dq_y1_dc_, 0, 127)];
    m->y1_.q_[1] = kAcTable[clip(q,                  0, 127)];

    m->y2_.q_[0] = kDcTable[ clip(q + enc->dq_y2_dc_, 0, 127)] * 2;
    m->y2_.q_[1] = kAcTable2[clip(q + enc->dq_y2_ac_, 0, 127)];

    m->uv_.q_[0] = kDcTable[clip(q + enc->dq_uv_dc_, 0, 117)];
    m->uv_.q_[1] = kAcTable[clip(q + enc->dq_uv_ac_, 0, 127)];

    q_i4  = ExpandMatrix(&m->y1_, 0);
    q_i16 = ExpandMatrix(&m->y2_, 1);
    q_uv  = ExpandMatrix(&m->uv_, 2);

    m->lambda_i4_          = (3 * q_i4 * q_i4) >> 7;
    m->lambda_i16_         = (3 * q_i16 * q_i16);
    m->lambda_uv_          = (3 * q_uv * q_uv) >> 6;
    m->lambda_mode_        = (1 * q_i4 * q_i4) >> 7;
    m->lambda_trellis_i4_  = (7 * q_i4 * q_i4) >> 3;
    m->lambda_trellis_i16_ = (q_i16 * q_i16) >> 2;
    m->lambda_trellis_uv_  = (q_uv * q_uv) << 1;
    m->tlambda_            = (tlambda_scale * q_i4) >> 5;

    // none of these constants should be < 1
    CheckLambdaValue(&m->lambda_i4_);
    CheckLambdaValue(&m->lambda_i16_);
    CheckLambdaValue(&m->lambda_uv_);
    CheckLambdaValue(&m->lambda_mode_);
    CheckLambdaValue(&m->lambda_trellis_i4_);
    CheckLambdaValue(&m->lambda_trellis_i16_);
    CheckLambdaValue(&m->lambda_trellis_uv_);
    CheckLambdaValue(&m->tlambda_);

    m->min_disto_ = 20 * m->y1_.q_[0];   // quantization-aware min disto
    m->max_edge_  = 0;

    m->i4_penalty_ = 1000 * q_i4 * q_i4;
  }
}